

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O2

void __thiscall
pstore::region::mem_based_factory::add
          (mem_based_factory *this,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t original_size,uint64_t new_size)

{
  __shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  std::__shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,
             &(this->file_).super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>)
  ;
  factory::append<pstore::file::in_memory,pstore::in_memory_mapper>
            (&this->super_factory,(shared_ptr<pstore::file::in_memory> *)&_Stack_38,regions,
             original_size,new_size);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  return;
}

Assistant:

void mem_based_factory::add (gsl::not_null<std::vector<memory_mapper_ptr> *> const regions,
                                     std::uint64_t const original_size,
                                     std::uint64_t const new_size) {

            this->append<file::in_memory, in_memory_mapper> (file_, regions, original_size,
                                                             new_size);
        }